

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void geomCallback(sqlite3_context *ctx,int nArg,sqlite3_value **aArg)

{
  bool bVar1;
  undefined8 *puVar2;
  sqlite3_uint64 n;
  undefined4 *pPtr;
  sqlite3_value *psVar3;
  double dVar4;
  int local_40;
  int i;
  int memErr;
  sqlite3_int64 nBlob;
  RtreeMatchArg *pBlob;
  RtreeGeomCallback *pGeomCtx;
  sqlite3_value **aArg_local;
  int nArg_local;
  sqlite3_context *ctx_local;
  
  puVar2 = (undefined8 *)sqlite3_user_data(ctx);
  bVar1 = false;
  n = (long)(nArg + -1) * 8 + 0x40 + (long)nArg * 8;
  pPtr = (undefined4 *)sqlite3_malloc64(n);
  if (pPtr == (undefined4 *)0x0) {
    sqlite3_result_error_nomem(ctx);
  }
  else {
    *pPtr = (int)n;
    *(undefined8 *)(pPtr + 2) = *puVar2;
    *(undefined8 *)(pPtr + 4) = puVar2[1];
    *(undefined8 *)(pPtr + 6) = puVar2[2];
    *(undefined8 *)(pPtr + 8) = puVar2[3];
    *(undefined4 **)(pPtr + 0xc) = pPtr + (long)nArg * 2 + 0xe;
    pPtr[10] = nArg;
    for (local_40 = 0; local_40 < nArg; local_40 = local_40 + 1) {
      psVar3 = sqlite3_value_dup(aArg[local_40]);
      *(sqlite3_value **)(*(long *)(pPtr + 0xc) + (long)local_40 * 8) = psVar3;
      if (*(long *)(*(long *)(pPtr + 0xc) + (long)local_40 * 8) == 0) {
        bVar1 = true;
      }
      dVar4 = sqlite3_value_double(aArg[local_40]);
      *(double *)(pPtr + (long)local_40 * 2 + 0xe) = dVar4;
    }
    if (bVar1) {
      sqlite3_result_error_nomem(ctx);
      rtreeMatchArgFree(pPtr);
    }
    else {
      sqlite3_result_pointer(ctx,pPtr,"RtreeMatchArg",rtreeMatchArgFree);
    }
  }
  return;
}

Assistant:

static void geomCallback(sqlite3_context *ctx, int nArg, sqlite3_value **aArg){
  RtreeGeomCallback *pGeomCtx = (RtreeGeomCallback *)sqlite3_user_data(ctx);
  RtreeMatchArg *pBlob;
  sqlite3_int64 nBlob;
  int memErr = 0;

  nBlob = sizeof(RtreeMatchArg) + (nArg-1)*sizeof(RtreeDValue)
           + nArg*sizeof(sqlite3_value*);
  pBlob = (RtreeMatchArg *)sqlite3_malloc64(nBlob);
  if( !pBlob ){
    sqlite3_result_error_nomem(ctx);
  }else{
    int i;
    pBlob->iSize = nBlob;
    pBlob->cb = pGeomCtx[0];
    pBlob->apSqlParam = (sqlite3_value**)&pBlob->aParam[nArg];
    pBlob->nParam = nArg;
    for(i=0; i<nArg; i++){
      pBlob->apSqlParam[i] = sqlite3_value_dup(aArg[i]);
      if( pBlob->apSqlParam[i]==0 ) memErr = 1;
#ifdef SQLITE_RTREE_INT_ONLY
      pBlob->aParam[i] = sqlite3_value_int64(aArg[i]);
#else
      pBlob->aParam[i] = sqlite3_value_double(aArg[i]);
#endif
    }
    if( memErr ){
      sqlite3_result_error_nomem(ctx);
      rtreeMatchArgFree(pBlob);
    }else{
      sqlite3_result_pointer(ctx, pBlob, "RtreeMatchArg", rtreeMatchArgFree);
    }
  }
}